

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv6Transmitter::SendRTCPData(RTPUDPv6Transmitter *this,void *data,size_t len)

{
  int iVar1;
  HashElement *pHVar2;
  
  iVar1 = -0x72;
  if (((this->init == true) && (iVar1 = -0x71, this->created == true)) &&
     (iVar1 = -0x75, len <= this->maxpacksize)) {
    pHVar2 = (this->destinations).firsthashelem;
    (this->destinations).curhashelem = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      do {
        sendto(this->rtcpsock,data,len,0,(sockaddr *)&(pHVar2->element).rtcpaddr,0x1c);
        pHVar2 = (this->destinations).curhashelem;
        if (pHVar2 == (HashElement *)0x0) {
          return 0;
        }
        pHVar2 = pHVar2->listnext;
        (this->destinations).curhashelem = pHVar2;
      } while (pHVar2 != (HashElement *)0x0);
    }
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::SendRTCPData(const void *data,size_t len)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	destinations.GotoFirstElement();
	while (destinations.HasCurrentElement())
	{
		sendto(rtcpsock,(const char *)data,len,0,(const struct sockaddr *)destinations.GetCurrentElement().GetRTCPSockAddr(),sizeof(struct sockaddr_in6));
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}